

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O3

void __thiscall
wasm::analysis::Stack<wasm::analysis::Inverted<wasm::analysis::ValType>_>::push
          (Stack<wasm::analysis::Inverted<wasm::analysis::ValType>_> *this,Element *elem,
          Element *element)

{
  iterator __position;
  
  __position._M_current =
       (elem->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if ((elem->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
      super__Vector_impl_data._M_start != __position._M_current || element->id != 0) {
    if (__position._M_current ==
        (elem->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                (elem,__position,element);
    }
    else {
      (__position._M_current)->id = element->id;
      (elem->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void push(Element& elem, typename L::Element&& element) const noexcept {
    if (elem.empty() && element == lattice.getBottom()) {
      // no-op, the stack is already entirely made of bottoms.
      return;
    }
    elem.emplace_back(std::move(element));
  }